

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  int iVar1;
  int *piVar2;
  int local_30;
  int _saved_errno;
  int fd;
  int use_fd;
  int close_fd;
  int error_fd_local;
  int (*pipes_local) [2];
  int stdio_count_local;
  uv_process_options_t *options_local;
  
  if ((options->flags & 8) != 0) {
    setsid();
  }
  for (local_30 = 0; local_30 < stdio_count; local_30 = local_30 + 1) {
    iVar1 = pipes[local_30][1];
    if ((-1 < iVar1) && (iVar1 < local_30)) {
      iVar1 = fcntl64(iVar1,0,stdio_count);
      pipes[local_30][1] = iVar1;
      if (pipes[local_30][1] == -1) {
        piVar2 = __errno_location();
        uv__write_int(error_fd,-*piVar2);
        _exit(0x7f);
      }
    }
  }
  local_30 = 0;
  do {
    if (stdio_count <= local_30) {
      for (local_30 = 0; local_30 < stdio_count; local_30 = local_30 + 1) {
        if (stdio_count <= pipes[local_30][1]) {
          uv__close(pipes[local_30][1]);
        }
      }
      if ((options->cwd != (char *)0x0) && (iVar1 = chdir(options->cwd), iVar1 != 0)) {
        piVar2 = __errno_location();
        uv__write_int(error_fd,-*piVar2);
        _exit(0x7f);
      }
      if ((options->flags & 3) != 0) {
        piVar2 = __errno_location();
        iVar1 = *piVar2;
        setgroups(0,(__gid_t *)0x0);
        piVar2 = __errno_location();
        *piVar2 = iVar1;
      }
      if (((options->flags & 2) != 0) && (iVar1 = setgid(options->gid), iVar1 != 0)) {
        piVar2 = __errno_location();
        uv__write_int(error_fd,-*piVar2);
        _exit(0x7f);
      }
      if (((options->flags & 1) != 0) && (iVar1 = setuid(options->uid), iVar1 != 0)) {
        piVar2 = __errno_location();
        uv__write_int(error_fd,-*piVar2);
        _exit(0x7f);
      }
      if (options->env != (char **)0x0) {
        _environ = options->env;
      }
      execvp(options->file,options->args);
      piVar2 = __errno_location();
      uv__write_int(error_fd,-*piVar2);
      _exit(0x7f);
    }
    fd = pipes[local_30][0];
    _saved_errno = pipes[local_30][1];
    if (_saved_errno < 0) {
      if (local_30 < 3) {
        iVar1 = 2;
        if (local_30 == 0) {
          iVar1 = 0;
        }
        _saved_errno = open64("/dev/null",iVar1);
        fd = _saved_errno;
        if (_saved_errno == -1) {
          piVar2 = __errno_location();
          uv__write_int(error_fd,-*piVar2);
          _exit(0x7f);
        }
        goto LAB_00a067f8;
      }
    }
    else {
LAB_00a067f8:
      if (local_30 == _saved_errno) {
        uv__cloexec_fcntl(_saved_errno,0);
      }
      else {
        local_30 = dup2(_saved_errno,local_30);
      }
      if (local_30 == -1) {
        piVar2 = __errno_location();
        uv__write_int(error_fd,-*piVar2);
        _exit(0x7f);
      }
      if (local_30 < 3) {
        uv__nonblock_fcntl(local_30,0);
      }
      if (stdio_count <= fd) {
        uv__close(fd);
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  int close_fd;
  int use_fd;
  int fd;

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
    if (pipes[fd][1] == -1) {
      uv__write_int(error_fd, -errno);
      _exit(127);
    }
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set
         */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd == -1) {
          uv__write_int(error_fd, -errno);
          _exit(127);
        }
      }
    }

    if (fd == use_fd)
      uv__cloexec_fcntl(use_fd, 0);
    else
      fd = dup2(use_fd, fd);

    if (fd == -1) {
      uv__write_int(error_fd, -errno);
      _exit(127);
    }

    if (fd <= 2)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];

    if (use_fd >= stdio_count)
      uv__close(use_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd)) {
    uv__write_int(error_fd, -errno);
    _exit(127);
  }

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid)) {
    uv__write_int(error_fd, -errno);
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid)) {
    uv__write_int(error_fd, -errno);
    _exit(127);
  }

  if (options->env != NULL) {
    environ = options->env;
  }

  execvp(options->file, options->args);
  uv__write_int(error_fd, -errno);
  _exit(127);
}